

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_mutex.hpp
# Opt level: O0

void __thiscall yamc::alternate::recursive_timed_mutex::unlock(recursive_timed_mutex *this)

{
  size_t sVar1;
  bool local_31;
  id local_30;
  native_handle_type local_28;
  id local_20;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lk;
  recursive_timed_mutex *this_local;
  
  lk._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtx_);
  local_31 = false;
  if (this->ncount_ != 0) {
    local_20._M_thread = (this->owner_)._M_thread;
    local_28 = (native_handle_type)std::this_thread::get_id();
    local_31 = std::operator==(local_20,(id)local_28);
  }
  if (local_31 == false) {
    __assert_fail("0 < ncount_ && owner_ == std::this_thread::get_id()",
                  "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/alternate_mutex.hpp"
                  ,0xfa,"void yamc::alternate::recursive_timed_mutex::unlock()");
  }
  sVar1 = this->ncount_ - 1;
  this->ncount_ = sVar1;
  if (sVar1 == 0) {
    std::thread::id::id(&local_30);
    (this->owner_)._M_thread = local_30._M_thread;
    std::condition_variable::notify_one();
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void unlock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    assert(0 < ncount_ && owner_ == std::this_thread::get_id());
    if (--ncount_ == 0) {
      owner_ = std::thread::id();
      cv_.notify_one();
    }
  }